

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::mlFg_Report(HModel *this)

{
  puts("\nReporting model/solver status and flags:\n");
  printf("problemStatus =          %2d\n",(ulong)(uint)this->problemStatus);
  printf("numberIteration =        %2d\n\n",(ulong)(uint)this->numberIteration);
  printf("mlFg_transposedLP =      %2d\n",(ulong)(uint)this->mlFg_transposedLP);
  printf("mlFg_scaledLP =          %2d\n",(ulong)(uint)this->mlFg_scaledLP);
  printf("mlFg_shuffledLP =        %2d\n",(ulong)(uint)this->mlFg_shuffledLP);
  printf("mlFg_haveBasis =         %2d\n",(ulong)(uint)this->mlFg_haveBasis);
  printf("mlFg_haveMatrixColWise = %2d\n",(ulong)(uint)this->mlFg_haveMatrixColWise);
  printf("mlFg_haveMatrixRowWise = %2d\n",(ulong)(uint)this->mlFg_haveMatrixRowWise);
  printf("mlFg_haveFactorArrays =  %2d\n",(ulong)(uint)this->mlFg_haveFactorArrays);
  printf("mlFg_haveEdWt =          %2d\n",(ulong)(uint)this->mlFg_haveEdWt);
  printf("mlFg_haveInvert =        %2d\n",(ulong)(uint)this->mlFg_haveInvert);
  printf("mlFg_haveFreshInvert =   %2d\n",(ulong)(uint)this->mlFg_haveFreshInvert);
  printf("mlFg_haveNonbasicDuals = %2d\n",(ulong)(uint)this->mlFg_haveNonbasicDuals);
  printf("mlFg_haveBasicPrimals =  %2d\n",(ulong)(uint)this->mlFg_haveBasicPrimals);
  printf("mlFg_haveFreshRebuild =  %2d\n",(ulong)(uint)this->mlFg_haveFreshRebuild);
  printf("mlFg_haveSavedBounds =   %2d\n\n",(ulong)(uint)this->mlFg_haveSavedBounds);
  std::ostream::flush();
  return;
}

Assistant:

void HModel::mlFg_Report() {
  printf("\nReporting model/solver status and flags:\n\n");
  printf("problemStatus =          %2d\n", problemStatus);
  printf("numberIteration =        %2d\n\n", numberIteration);
  printf("mlFg_transposedLP =      %2d\n", mlFg_transposedLP);
  printf("mlFg_scaledLP =          %2d\n", mlFg_scaledLP);
  printf("mlFg_shuffledLP =        %2d\n", mlFg_shuffledLP);
  printf("mlFg_haveBasis =         %2d\n", mlFg_haveBasis);
  printf("mlFg_haveMatrixColWise = %2d\n", mlFg_haveMatrixColWise);
  printf("mlFg_haveMatrixRowWise = %2d\n", mlFg_haveMatrixRowWise);
  printf("mlFg_haveFactorArrays =  %2d\n", mlFg_haveFactorArrays);
  printf("mlFg_haveEdWt =          %2d\n", mlFg_haveEdWt);
  printf("mlFg_haveInvert =        %2d\n", mlFg_haveInvert);
  printf("mlFg_haveFreshInvert =   %2d\n", mlFg_haveFreshInvert);
  printf("mlFg_haveNonbasicDuals = %2d\n", mlFg_haveNonbasicDuals);
  printf("mlFg_haveBasicPrimals =  %2d\n", mlFg_haveBasicPrimals);
  printf("mlFg_haveFreshRebuild =  %2d\n", mlFg_haveFreshRebuild);
  printf("mlFg_haveSavedBounds =   %2d\n\n", mlFg_haveSavedBounds);
  cout<<flush;
}